

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall btGeneric6DofConstraint::calculateLinearInfo(btGeneric6DofConstraint *this)

{
  btScalar test_value;
  int i;
  long lVar1;
  btVector3 bVar2;
  btMatrix3x3 local_50;
  
  bVar2 = operator-(&(this->m_calculatedTransformB).m_origin,
                    &(this->m_calculatedTransformA).m_origin);
  *&(this->m_calculatedLinearDiff).m_floats = bVar2.m_floats;
  btMatrix3x3::inverse(&(this->m_calculatedTransformA).m_basis);
  bVar2 = operator*(&local_50,&this->m_calculatedLinearDiff);
  *&(this->m_calculatedLinearDiff).m_floats = bVar2.m_floats;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    test_value = (this->m_calculatedLinearDiff).m_floats[lVar1];
    (this->m_linearLimits).m_currentLinearDiff.m_floats[lVar1] = test_value;
    btTranslationalLimitMotor::testLimitValue(&this->m_linearLimits,(int)lVar1,test_value);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateLinearInfo()
{
	m_calculatedLinearDiff = m_calculatedTransformB.getOrigin() - m_calculatedTransformA.getOrigin();
	m_calculatedLinearDiff = m_calculatedTransformA.getBasis().inverse() * m_calculatedLinearDiff;
	for(int i = 0; i < 3; i++)
	{
		m_linearLimits.m_currentLinearDiff[i] = m_calculatedLinearDiff[i];
		m_linearLimits.testLimitValue(i, m_calculatedLinearDiff[i]);
	}
}